

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O2

void __thiscall
CorruptInternalNodes_ChildPointsToParent_Test::~CorruptInternalNodes_ChildPointsToParent_Test
          (CorruptInternalNodes_ChildPointsToParent_Test *this)

{
  anon_unknown.dwarf_13be9a::CorruptInternalNodes::~CorruptInternalNodes
            (&this->super_CorruptInternalNodes);
  operator_delete(this,0x160);
  return;
}

Assistant:

TEST_F (CorruptInternalNodes, ChildPointsToParent) {
    {
        transaction_type t1 = begin (db_, lock_guard{mutex_});
        this->build (t1);

        index_pointer root = index_->root ();
        this->check_is_store_internal_node (root);

        // Corrupt the first child field such that it points back to the root.
        {
            auto inode = this->load_inode (root);
            (*inode)[0] = root;
        }

        t1.commit ();
    }
    this->iterate ();
    this->find ();
}